

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringconverter.cpp
# Opt level: O2

QByteArray *
QUtf8::convertFromUnicode(QByteArray *__return_storage_ptr__,QStringView in,State *state)

{
  QUtf8 *this;
  char *pcVar1;
  char *pcVar2;
  __off_t __length;
  State *in_R8;
  QStringView in_00;
  
  in_00.m_size = in.m_data;
  (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).ptr = &DAT_aaaaaaaaaaaaaaaa;
  QByteArray::QByteArray(__return_storage_ptr__,(long)in.m_size * 3 + 3,Uninitialized);
  this = (QUtf8 *)QByteArray::data(__return_storage_ptr__);
  in_00.m_data = (storage_type_conflict *)state;
  pcVar1 = convertFromUnicode(this,(char *)in.m_size,in_00,in_R8);
  pcVar2 = QByteArray::data(__return_storage_ptr__);
  QByteArray::truncate(__return_storage_ptr__,pcVar1 + -(long)pcVar2,__length);
  return __return_storage_ptr__;
}

Assistant:

QByteArray QUtf8::convertFromUnicode(QStringView in, QStringConverter::State *state)
{
    QByteArray ba(3*in.size() +3, Qt::Uninitialized);
    char *end = convertFromUnicode(ba.data(), in, state);
    ba.truncate(end - ba.data());
    return ba;
}